

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O1

ssize_t __thiscall
boost::deflate::deflate_stream_test::ZlibCompressor::write
          (ZlibCompressor *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  ulong uVar2;
  undefined8 uVar3;
  ulong uVar4;
  error_code eVar5;
  invalid_argument local_30 [16];
  source_location local_20;
  
  if (((this->zs).next_in == (Bytef *)0x0) && ((this->zs).avail_in != 0)) {
    std::invalid_argument::invalid_argument(local_30,"zlib compressor: invalid input");
    local_20.file_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
    ;
    local_20.function_ =
         "virtual error_code boost::deflate::deflate_stream_test::ZlibCompressor::write(Flush)";
    local_20.line_ = 0x5e;
    local_20.column_ = 0;
    throw_exception<std::invalid_argument>(local_30,&local_20);
  }
  uVar1 = ::deflate(&this->zs,write::zlib_flushes[__fd]);
  switch(uVar1) {
  case 0:
    uVar2 = (ulong)uVar1;
    uVar4 = uVar2;
    goto LAB_00107471;
  case 1:
    eVar5 = make_error_code(end_of_stream);
    uVar2 = eVar5._0_8_;
    break;
  case 0xfffffffb:
    eVar5 = make_error_code(need_buffers);
    uVar2 = eVar5._0_8_;
    break;
  default:
    uVar3 = __cxa_rethrow();
    __clang_call_terminate(uVar3);
  case 0xfffffffe:
    eVar5 = make_error_code(stream_error);
    uVar2 = eVar5._0_8_;
  }
  uVar4 = uVar2 & 0xffffff0000000000;
LAB_00107471:
  return uVar2 & 0xffffffffff | uVar4;
}

Assistant:

error_code write(Flush flush) override {
            constexpr static int zlib_flushes[] = {0, Z_BLOCK, Z_PARTIAL_FLUSH, Z_SYNC_FLUSH, Z_FULL_FLUSH, Z_FINISH, Z_TREES};
            const auto zlib_flush = zlib_flushes[static_cast<int>(flush)];
            if(zs.next_in == nullptr && zs.avail_in != 0)
              BOOST_THROW_EXCEPTION(std::invalid_argument{"zlib compressor: invalid input"});
            const auto res = ::deflate(&zs, zlib_flush);
            switch(res){
            case Z_OK:
                return {};
            case Z_STREAM_END:
                return error::end_of_stream;
            case Z_STREAM_ERROR:
                return error::stream_error;
            case Z_BUF_ERROR:
                return error::need_buffers;
            default:
                throw;
            }
        }